

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtpaths.cpp
# Opt level: O2

StringEnum * parseLocationOrError(QString *locationString)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 == 0x170) {
      local_48.d.size = -0x5555555555555556;
      local_60.d = (Data *)0x0;
      local_48.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_48.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_60.ptr = L"Unknown location: %1";
      local_60.size = 0x14;
      QString::QString(&local_48,&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      QString::arg<QString,_true>((QString *)&local_60,&local_48,locationString,0,(QChar)0x20);
      error((QString *)&local_60);
    }
    QLatin1String::QLatin1String
              ((QLatin1String *)&local_48,*(char **)((long)&lookupTableData[0].stringvalue + lVar3))
    ;
    bVar2 = operator==(locationString,(QLatin1String *)&local_48);
    lVar1 = lVar3 + 0x10;
  } while (!bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (StringEnum *)((long)&lookupTableData[0].stringvalue + lVar3);
  }
  __stack_chk_fail();
}

Assistant:

static const StringEnum &parseLocationOrError(const QString &locationString)
{
    for (const StringEnum &se : lookupTableData)
        if (locationString == QLatin1StringView(se.stringvalue))
            return se;

    QString message = QStringLiteral("Unknown location: %1");
    error(message.arg(locationString));
}